

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

_Bool askfor_aux_numbers(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                        _Bool firsttime)

{
  keycode_t kVar1;
  _Bool _Var2;
  keypress keypress_00;
  
  keypress_00._0_8_ = keypress._0_8_;
  kVar1 = keypress.code;
  if ((9 < kVar1 - 0x30) &&
     (((0x1e < kVar1 - 0x81 || ((0x68000003U >> (kVar1 - 0x81 & 0x1f) & 1) == 0)) &&
      (kVar1 != 0xe000)))) {
    return false;
  }
  keypress_00._8_4_ = keypress._8_4_ & 0xff;
  _Var2 = askfor_aux_keypress(buf,buflen,curs,len,keypress_00,firsttime);
  return _Var2;
}

Assistant:

static bool askfor_aux_numbers(char *buf, size_t buflen, size_t *curs, size_t *len, struct keypress keypress, bool firsttime)
{
	switch (keypress.code)
	{
		case ESCAPE:
		case KC_ENTER:
		case ARROW_LEFT:
		case ARROW_RIGHT:
		case KC_DELETE:
		case KC_BACKSPACE:
		case '0':
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
			return askfor_aux_keypress(buf, buflen, curs, len, keypress,
									   firsttime);
	}

	return false;
}